

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.h
# Opt level: O0

void features::Matching::oneway_match<float>
               (Options *options,float *set_1,int set_1_size,float *set_2,int set_2_size,
               vector<int,_std::allocator<int>_> *result)

{
  float fVar1;
  float *pfVar2;
  float square_lowe_thres;
  float square_dist_2st_best;
  float square_dist_1st_best;
  float *query_pointer;
  Result nn_result;
  int i;
  NearestNeighbor<float> nn;
  float square_dist_thres;
  vector<int,_std::allocator<int>_> *result_local;
  int set_2_size_local;
  float *set_2_local;
  int set_1_size_local;
  float *set_1_local;
  Options *options_local;
  
  std::vector<int,_std::allocator<int>_>::clear(result);
  nn.elements._4_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (result,(long)set_1_size,(value_type_conflict1 *)((long)&nn.elements + 4));
  if ((set_1_size != 0) && (set_2_size != 0)) {
    nn.elements._0_4_ = options->distance_threshold * options->distance_threshold;
    NearestNeighbor<float>::NearestNeighbor((NearestNeighbor<float> *)&nn_result.index_2nd_best);
    NearestNeighbor<float>::set_elements((NearestNeighbor<float> *)&nn_result.index_2nd_best,set_2);
    NearestNeighbor<float>::set_num_elements
              ((NearestNeighbor<float> *)&nn_result.index_2nd_best,set_2_size);
    NearestNeighbor<float>::set_element_dimensions
              ((NearestNeighbor<float> *)&nn_result.index_2nd_best,options->descriptor_length);
    for (nn_result.index_1st_best = 0; nn_result.index_1st_best < set_1_size;
        nn_result.index_1st_best = nn_result.index_1st_best + 1) {
      NearestNeighbor<float>::find
                ((NearestNeighbor<float> *)&nn_result.index_2nd_best,
                 set_1 + nn_result.index_1st_best * options->descriptor_length,
                 (Result *)((long)&query_pointer + 4));
      fVar1 = nn_result.dist_1st_best;
      if (query_pointer._4_4_ <= nn.elements._0_4_) {
        pfVar2 = (float *)std::vector<int,_std::allocator<int>_>::at
                                    (result,(long)nn_result.index_1st_best);
        *pfVar2 = fVar1;
      }
    }
  }
  return;
}

Assistant:

void
Matching::oneway_match (Options const& options,
    T const* set_1, int set_1_size,
    T const* set_2, int set_2_size,
    std::vector<int>* result)
{
    result->clear();
    result->resize(set_1_size, -1);
    if (set_1_size == 0 || set_2_size == 0)
        return;

    // 与最近邻距离的阈值
    float const square_dist_thres = MATH_POW2(options.distance_threshold);

    // 以描述子为特征，计算每个特征点的最近邻和次近邻
    NearestNeighbor<T> nn;
    nn.set_elements(set_2);
    // 特征点的个数
    nn.set_num_elements(set_2_size);
    // 设置特征描述子的维度 sift 128, surf 64
    nn.set_element_dimensions(options.descriptor_length);

    for (int i = 0; i < set_1_size; ++i)
    {
        // 每个特征点最近邻搜索的结果
        typename NearestNeighbor<T>::Result nn_result;

        // feature sets 1 中第i个特征点的特征描述子
        T const* query_pointer = set_1 + i * options.descriptor_length;

        // 计算最近邻
        nn.find(query_pointer, &nn_result);

        // 标准1： 与最近邻的距离必须小于特定阈值
        if (nn_result.dist_1st_best > square_dist_thres)
            continue;




        /***********************task2*************************************/
        // 标准2： 与最近邻和次紧邻的距离比必须小于特定阈值
        /*
         * 参考标准1的形式给出lowe-ratio约束
         */
        float square_dist_1st_best = static_cast<float>(nn_result.dist_1st_best);
        float square_dist_2st_best = static_cast<float>(nn_result.dist_2nd_best);
        float const square_lowe_thres = MATH_POW2(options.lowe_ratio_threshold);

               /*                  */
               /*    此处添加代码    */
               /*                  */
        /*****************************************************************/





//        if (static_cast<float>(nn_result.dist_1st_best)
//            / static_cast<float>(nn_result.dist_2nd_best)
//            > square_lowe_thres)
//            continue;
        // 匹配成功，feature set1 中第i个特征值对应feature set2中的第index_1st_best个特征点
        result->at(i) = nn_result.index_1st_best;
    }
}